

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::UpdateImpl(cmCTestP4 *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  char *pcVar6;
  reference cmd;
  undefined1 local_3e0 [8];
  OutputLogger err;
  OutputLogger out;
  value_type local_358;
  char local_34a [2];
  char *local_348;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  undefined1 local_338 [8];
  string date;
  string source;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_2b0;
  string local_290;
  allocator<char> local_269;
  string local_268;
  undefined1 local_248 [8];
  string opts;
  undefined1 local_220 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_sync;
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string custom;
  cmCTestP4 *this_local;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  custom.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"P4UpdateCustom",&local_59)
  ;
  cmCTest::GetCTestConfiguration((string *)local_38,pcVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_local._7_1_ = UpdateCustom(this,(string *)local_38);
  }
  else {
    bVar2 = std::operator==(&(this->super_cmCTestGlobalVC).OldRevision,"<unknown>");
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.UpdateCommandLine,
                 "Unknown current revision");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::operator<<((ostream *)local_1e8,"   Unknown current revision\n");
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestP4.cxx"
                   ,0x1e8,pcVar6,false);
      std::__cxx11::string::~string
                ((string *)
                 &p4_sync.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      this_local._7_1_ = false;
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220);
      SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_220);
      opts.field_2._8_8_ = (long)"async" + 1;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220,
                 (value_type *)((long)&opts.field_2 + 8));
      pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"UpdateOptions",&local_269);
      cmCTest::GetCTestConfiguration((string *)local_248,pcVar1,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"P4UpdateOptions",
                   (allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmCTest::GetCTestConfiguration(&local_290,pcVar1,&local_2b0);
        std::__cxx11::string::operator=((string *)local_248,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      cmSystemTools::ParseArguments
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1,(string *)local_248);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1);
      arg = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg), bVar2) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end1);
        source.field_2._8_8_ = std::__cxx11::string::c_str();
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220,
                   (value_type *)((long)&source.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&date.field_2 + 8),
                     &(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...");
      iVar3 = cmCTest::GetTestModel((this->super_cmCTestGlobalVC).super_cmCTestVC.CTest);
      if (iVar3 == 1) {
        cmCTestVC::GetNightlyTime_abi_cxx11_((string *)local_338,(cmCTestVC *)this);
        local_340._M_current = (char *)std::__cxx11::string::begin();
        local_348 = (char *)std::__cxx11::string::end();
        local_34a[1] = 0x2d;
        local_34a[0] = '/';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_340,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_348,local_34a + 1,local_34a);
        psVar5 = (string *)std::__cxx11::string::append(date.field_2._M_local_buf + 8);
        pcVar6 = (char *)std::__cxx11::string::append(psVar5);
        std::__cxx11::string::append(pcVar6);
        std::__cxx11::string::~string((string *)local_338);
      }
      local_358 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220,&local_358);
      out.super_LineParser.Separator = '\0';
      out.super_LineParser.LineEnd = '\0';
      out.super_LineParser.IgnoreCR = false;
      out.super_LineParser._59_5_ = 0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220,
                 (value_type *)&out.super_LineParser.Separator);
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)&err.super_LineParser.Separator,
                 (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_sync-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_3e0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "p4_sync-err> ");
      cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220,0);
      this_local._7_1_ =
           cmCTestVC::RunUpdateCommand
                     ((cmCTestVC *)this,cmd,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_3e0,Auto);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_3e0);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
      std::__cxx11::string::~string((string *)(date.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)local_248);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_220);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool cmCTestP4::UpdateImpl()
{
  std::string custom = this->CTest->GetCTestConfiguration("P4UpdateCustom");
  if (!custom.empty()) {
    return this->UpdateCustom(custom);
  }

  // If we couldn't get a revision number before updating, abort.
  if (this->OldRevision == "<unknown>") {
    this->UpdateCommandLine = "Unknown current revision";
    cmCTestLog(this->CTest, ERROR_MESSAGE, "   Unknown current revision\n");
    return false;
  }

  std::vector<char const*> p4_sync;
  SetP4Options(p4_sync);

  p4_sync.push_back("sync");

  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("P4UpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    p4_sync.push_back(arg.c_str());
  }

  std::string source = this->SourceDirectory + "/...";

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    std::string date = this->GetNightlyTime();
    // CTest reports the date as YYYY-MM-DD, Perforce needs it as YYYY/MM/DD
    std::replace(date.begin(), date.end(), '-', '/');

    // Revision specification: /...@"YYYY/MM/DD HH:MM:SS"
    source.append("@\"").append(date).append("\"");
  }

  p4_sync.push_back(source.c_str());
  p4_sync.push_back(nullptr);

  OutputLogger out(this->Log, "p4_sync-out> ");
  OutputLogger err(this->Log, "p4_sync-err> ");

  return this->RunUpdateCommand(&p4_sync[0], &out, &err);
}